

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

int sort_rooms_ring_comp(void *va,void *vb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  
  iVar11 = *(int *)((long)va + 4);
  iVar2 = *(int *)((long)va + 8);
  iVar7 = *(int *)((long)va + 0xc) + iVar11;
  iVar3 = *(int *)((long)vb + 4);
  iVar4 = *(int *)((long)vb + 8);
  iVar1 = *(int *)((long)vb + 0xc) + iVar3;
  iVar10 = *(int *)((long)va + 0x10) + iVar2;
  iVar6 = iVar4 + *(int *)((long)vb + 0x10);
  bVar5 = (iVar10 < 0x14) * '\x03';
  if (iVar7 < 0x4f) {
    bVar5 = (iVar10 < 0x14) + 1;
  }
  bVar8 = (iVar6 < 0x14) * '\x03';
  if (iVar1 < 0x4f) {
    bVar8 = (iVar6 < 0x14) + 1;
  }
  if (bVar5 != bVar8) {
    return -(uint)(bVar5 < bVar8) | 1;
  }
  uVar9 = iVar7 - 0x4f;
  if (2 < iVar1 - 0x4fU || 2 < uVar9) {
    if (iVar1 - 0x4fU < 3 || uVar9 < 3) {
      return -(uint)(uVar9 < 3) | 1;
    }
    iVar10 = (((iVar10 - (*(int *)((long)va + 0x10) + iVar2 + -0x15 >> 0x1f)) + -0x15 >> 1) * 0x50)
             / ((iVar7 - (*(int *)((long)va + 0xc) + iVar11 + -0x50 >> 0x1f)) + -0x50 >> 1);
    iVar7 = (((iVar6 - (*(int *)((long)vb + 0x10) + iVar4 + -0x15 >> 0x1f)) + -0x15 >> 1) * 0x50) /
            ((iVar1 - (*(int *)((long)vb + 0xc) + iVar3 + -0x50 >> 0x1f)) + -0x50 >> 1);
    if (iVar10 != iVar7) {
      return (uint)(iVar7 <= iVar10) * 2 + -1;
    }
  }
  iVar11 = iVar11 - iVar3;
  if (iVar11 == 0) {
    iVar11 = iVar2 - iVar4;
  }
  return iVar11;
}

Assistant:

static int sort_rooms_ring_comp(const void *va, const void *vb)
{
	const struct sort_rooms_data *a, *b;
	int ax, ay, bx, by;	/* x and y relative to map center */
	int aquad, bquad;	/* quadrants of rooms */

	a = (const struct sort_rooms_data *)va;
	b = (const struct sort_rooms_data *)vb;

	ax = (a->lx + a->hx - COLNO) / 2;
	bx = (b->lx + b->hx - COLNO) / 2;
	ay = (a->ly + a->hy - ROWNO) / 2;
	by = (b->ly + b->hy - ROWNO) / 2;

	/*
	 * Avoid expensive sqrt/atan2 calls by comparing
	 * quadrants and tangents directly.
	 *
	 *  2 | 3
	 * ---+---
	 *  1 | 0
	 */
	aquad = (ax >= 0) ? (ay >= 0 ? 0 : 3) : (ay >= 0 ? 1 : 2);
	bquad = (bx >= 0) ? (by >= 0 ? 0 : 3) : (by >= 0 ? 1 : 2);

	if (aquad != bquad)
	    return (aquad < bquad) ? -1 : 1;

	/* Same quad? Compare tan values: ay/ax vs. by/bx */
	if (ax == 0 && bx == 0) {
	    /* Avoid unstable sort effects across qsort implementations. */
	    return sort_rooms_standard_comp(va, vb);
	} else if (ax == 0) {
	    return -1;
	} else if (bx == 0) {
	    return 1;
	} else {
	    /* COLNO factor (longer level axis) to reduce rounding errors */
	    int ayx = COLNO * ay / ax;
	    int byx = COLNO * by / bx;
	    if (ayx == byx) {
		/* Again, avoid implementation qsort instability. */
		return sort_rooms_standard_comp(va, vb);
	    } else if (ayx < byx) {
		return -1;
	    } else {
		return 1;
	    }
	}
}